

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O3

bool __thiscall dg::pta::PSNodeRet::addReturnSite(PSNodeRet *this,PSNode *r)

{
  pointer *pppPVar1;
  iterator __position;
  PSNode **ppPVar2;
  PSNode *local_8;
  
  ppPVar2 = (this->returns).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->returns).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppPVar2 == __position._M_current) {
      if (__position._M_current ==
          (this->returns).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_8 = r;
        std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
        _M_realloc_insert<dg::pta::PSNode*const&>
                  ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&this->returns,
                   __position,&local_8);
      }
      else {
        *__position._M_current = r;
        pppPVar1 = &(this->returns).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      return true;
    }
    if (*ppPVar2 == r) break;
    ppPVar2 = ppPVar2 + 1;
  }
  return false;
}

Assistant:

bool addReturnSite(PSNode *r) {
        // we suppose there are just few callees,
        // so this should be faster than std::set
        for (PSNode *p : returns) {
            if (p == r)
                return false;
        }

        returns.push_back(r);
        return true;
    }